

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTriangles.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTrianglesIdenticalTriangles::initTest
          (TessellationShaderTrianglesIdenticalTriangles *this)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  GLenum GVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  TestError *this_01;
  NotSupportedError *this_02;
  pointer p_Var7;
  value_type local_248;
  _runs *local_1e0;
  _tessellation_levels_set levels_sets;
  GLint gl_max_tess_gen_level_value;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b8);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
  this->m_utils = this_00;
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x248);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x24b);
  gl_max_tess_gen_level_value = 0;
  (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                     &gl_max_tess_gen_level_value);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x251);
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            (&levels_sets,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,gl_max_tess_gen_level_value,
             TESSELLATION_LEVEL_SET_FILTER_EXCLUDE_NEGATIVE_BASE_VALUE|
             TESSELLATION_LEVEL_SET_FILTER_ALL_COMBINATIONS);
  if (levels_sets.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      levels_sets.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_1e0 = &this->m_runs;
    p_Var7 = levels_sets.
             super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.n_vertices = 0;
      local_248.base_inner = *&p_Var7->inner;
      local_248.base_outer._0_8_ = *(undefined8 *)p_Var7->outer;
      local_248.base_outer._8_8_ = *(undefined8 *)(p_Var7->outer + 2);
      local_248.reference_inner[1] = local_248.base_inner[1] * 0.25;
      local_248.reference_inner[0] = local_248.base_inner[0];
      local_248.reference_outer[3] = local_248.base_outer[3] * 0.25;
      local_248.reference_outer[2] = local_248.base_outer[2];
      local_248.reference_outer._0_8_ = local_248.base_outer._0_8_;
      uVar5 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                        (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                         local_248.base_inner,local_248.base_outer,
                         TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
      uVar6 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                        (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                         local_248.reference_inner,local_248.reference_outer,
                         TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
      if (uVar5 == 0) {
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "No vertices were generated by tessellator for: inner tess levels:[",0x42);
        std::ostream::_M_insert<double>((double)local_248.base_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_248.base_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], primitive mode: triangles, vertex spacing: equal.",
                   0x34);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Zero vertices were generated by tessellator for base test pass",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x284);
LAB_00cc1006:
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (uVar6 == 0) {
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "No vertices were generated by tessellator for: inner tess levels:[",0x42);
        std::ostream::_M_insert<double>((double)local_248.reference_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], primitive mode: triangles, vertex spacing: equal.",
                   0x34);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Zero vertices were generated by tessellator for reference test pass",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x295);
        goto LAB_00cc1006;
      }
      if (uVar5 != uVar6) {
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "Amount of vertices generated by the tessellator differs for the following inner/outer configs: inner tess levels:["
                   ,0x72);
        std::ostream::_M_insert<double>((double)local_248.base_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_248.base_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.base_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"] and inner tess levels:[",0x19);
        std::ostream::_M_insert<double>((double)local_248.reference_inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_248.reference_outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], primitive mode: triangles, vertex spacing: equal.",
                   0x34);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,
                   "Amount of vertices generated by tessellator differs between base and references passes"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x2ae);
        goto LAB_00cc1006;
      }
      local_248.n_vertices = uVar5;
      TessellationShaderUtils::getDataGeneratedByTessellator
                ((vector<char,_std::allocator<char>_> *)local_1b8,this->m_utils,local_248.base_inner
                 ,false,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                 TESSELLATION_SHADER_VERTEX_ORDERING_CCW,TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
                 local_248.base_outer);
      pcVar2 = local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pcVar1 = local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1b8;
      local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pp_Stack_1b0;
      local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8[0]._0_8_;
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_1a8[0]._M_allocated_capacity = (pointer)0x0;
      if ((pcVar1 != (pointer)0x0) &&
         (operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1), local_1b8 != (undefined1  [8])0x0)) {
        operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
      }
      TessellationShaderUtils::getDataGeneratedByTessellator
                ((vector<char,_std::allocator<char>_> *)local_1b8,this->m_utils,
                 local_248.reference_inner,false,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                 TESSELLATION_SHADER_VERTEX_ORDERING_CCW,TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
                 local_248.reference_outer);
      pcVar2 = local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pcVar1 = local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1b8;
      local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pp_Stack_1b0;
      local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8[0]._0_8_;
      local_1b8 = (undefined1  [8])0x0;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_1a8[0]._M_allocated_capacity = (pointer)0x0;
      if ((pcVar1 != (pointer)0x0) &&
         (operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1), local_1b8 != (undefined1  [8])0x0)) {
        operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
      }
      std::
      vector<glcts::TessellationShaderTrianglesIdenticalTriangles::_run,_std::allocator<glcts::TessellationShaderTrianglesIdenticalTriangles::_run>_>
      ::push_back(local_1e0,&local_248);
      if ((TestLog *)
          local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (TestLog *)0x0) {
        operator_delete(local_248.reference_data.super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.reference_data.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.reference_data.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((TestLog *)
          local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (TestLog *)0x0) {
        operator_delete(local_248.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_248.base_data.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.base_data.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var7 = p_Var7 + 1;
    } while (p_Var7 != levels_sets.
                       super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (levels_sets.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(levels_sets.
                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)levels_sets.
                          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)levels_sets.
                          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TessellationShaderTrianglesIdenticalTriangles::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test runs */
	_tessellation_level_set_filter filter =
		(_tessellation_level_set_filter)((int)TESSELLATION_LEVEL_SET_FILTER_ALL_COMBINATIONS |
										 (int)TESSELLATION_LEVEL_SET_FILTER_EXCLUDE_NEGATIVE_BASE_VALUE);

	_tessellation_levels_set levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, gl_max_tess_gen_level_value, filter);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		_run						run;
		const _tessellation_levels& set = *set_iterator;

		memcpy(run.base_inner, set.inner, sizeof(run.base_inner));
		memcpy(run.base_outer, set.outer, sizeof(run.base_outer));

		run.reference_inner[0] = run.base_inner[0];
		run.reference_inner[1] = run.base_inner[1] * 0.25f;

		run.reference_outer[0] = run.base_outer[0];
		run.reference_outer[1] = run.base_outer[1];
		run.reference_outer[2] = run.base_outer[2];
		run.reference_outer[3] = run.base_outer[3] * 0.25f;

		/* Retrieve vertex data for both passes */
		glw::GLint n_base_vertices		= 0;
		glw::GLint n_reference_vertices = 0;

		n_base_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.base_inner, run.base_outer,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, false);
		n_reference_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.reference_inner, run.reference_outer,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, false); /* is_point_mode_enabled */

		if (n_base_vertices == 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
														   "inner tess levels:"
														   "["
							   << run.base_inner[0] << ", " << run.base_inner[1] << "]"
																					", outer tess levels:"
																					"["
							   << run.base_outer[0] << ", " << run.base_outer[1] << ", " << run.base_outer[2] << ", "
							   << run.base_outer[3] << "]"
													   ", primitive mode: triangles, vertex spacing: equal."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Zero vertices were generated by tessellator for base test pass");
		}

		if (n_reference_vertices == 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
														   "inner tess levels:"
														   "["
							   << run.reference_inner[0] << ", " << run.reference_inner[1] << "]"
																							  ", outer tess levels:"
																							  "["
							   << run.reference_outer[0] << ", " << run.reference_outer[1] << ", "
							   << run.reference_outer[2] << ", " << run.reference_outer[3]
							   << "]"
								  ", primitive mode: triangles, vertex spacing: equal."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Zero vertices were generated by tessellator for reference test pass");
		}

		if (n_base_vertices != n_reference_vertices)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Amount of vertices generated by the tessellator differs"
														   " for the following inner/outer configs: "
														   "inner tess levels:"
														   "["
							   << run.base_inner[0] << ", " << run.base_inner[1] << "]"
																					", outer tess levels:"
																					"["
							   << run.base_outer[0] << ", " << run.base_outer[1] << ", " << run.base_outer[2] << ", "
							   << run.base_outer[3] << "]"
													   " and inner tess levels:"
													   "["
							   << run.reference_inner[0] << ", " << run.reference_inner[1] << "]"
																							  ", outer tess levels:"
																							  "["
							   << run.reference_outer[0] << ", " << run.reference_outer[1] << ", "
							   << run.reference_outer[2] << ", " << run.reference_outer[3]
							   << "]"
								  ", primitive mode: triangles, vertex spacing: equal."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Amount of vertices generated by tessellator differs between base and references passes");
		}

		run.n_vertices = n_base_vertices;

		run.base_data = m_utils->getDataGeneratedByTessellator(
			run.base_inner, false, /* is_point_mode_enabled */
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, run.base_outer);
		run.reference_data = m_utils->getDataGeneratedByTessellator(
			run.reference_inner, false, /* is_point_mode_enabled */
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, run.reference_outer);

		/* Store the run data */
		m_runs.push_back(run);
	} /* for (all sets) */
}